

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QShaderDescription::PushConstantBlock>::begin
          (QList<QShaderDescription::PushConstantBlock> *this)

{
  PushConstantBlock *n;
  QArrayDataPointer<QShaderDescription::PushConstantBlock> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QShaderDescription::PushConstantBlock> *)0x6e4e49);
  QArrayDataPointer<QShaderDescription::PushConstantBlock>::operator->(in_RDI);
  n = QArrayDataPointer<QShaderDescription::PushConstantBlock>::begin
                ((QArrayDataPointer<QShaderDescription::PushConstantBlock> *)0x6e4e5a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }